

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O1

int secp256k1_bulletproof_rangeproof_verify_impl
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_scratch *scratch,uchar **proof,
              size_t n_proofs,size_t plen,size_t nbits,uint64_t **min_value,secp256k1_ge **commitp,
              size_t n_commits,secp256k1_ge *value_gen,secp256k1_bulletproof_generators *gens,
              uchar **extra_commit,size_t *extra_commit_len)

{
  ulong uVar1;
  secp256k1_ge *r_00;
  secp256k1_ge *r_01;
  int *piVar2;
  undefined8 *puVar3;
  int *piVar4;
  bool bVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  secp256k1_scratch *psVar9;
  int iVar10;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  undefined4 extraout_EAX_03;
  int iVar11;
  undefined4 extraout_EAX_04;
  undefined4 extraout_EAX_05;
  size_t ret;
  long lVar12;
  uint64_t *puVar13;
  uchar **ppuVar14;
  long lVar15;
  size_t sVar16;
  size_t sVar17;
  int iVar18;
  size_t sVar19;
  secp256k1_scalar *r_02;
  secp256k1_scalar *psVar20;
  secp256k1_sha256 *psVar21;
  ulong uVar22;
  uint64_t *puVar23;
  secp256k1_scalar *psVar24;
  ulong uVar25;
  secp256k1_gej *r_03;
  long lVar26;
  void *pvVar27;
  ulong uVar28;
  size_t sVar29;
  uchar **ppuVar30;
  uchar *puVar31;
  bool bVar32;
  byte bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int overflow;
  secp256k1_scalar taux;
  uchar commit [32];
  secp256k1_scalar mu;
  secp256k1_ge sge;
  secp256k1_gej r;
  secp256k1_ge age;
  uchar vbuf [8];
  uchar randomizer61 [32];
  undefined4 local_344;
  size_t local_340;
  secp256k1_scratch *local_338;
  byte local_329;
  void *local_328;
  void *local_320;
  uchar **local_318;
  size_t local_310;
  secp256k1_scalar *local_308;
  size_t local_300;
  ulong local_2f8;
  uint64_t local_2f0;
  uchar **local_2e8;
  secp256k1_scalar *local_2e0;
  secp256k1_scalar local_2d8;
  uint64_t *local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  secp256k1_scalar local_298;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  long local_250;
  ulong local_248;
  secp256k1_scalar local_240;
  undefined1 local_220 [16];
  uint64_t uStack_210;
  uint64_t local_208;
  uint64_t uStack_200;
  secp256k1_ge *local_1f8;
  secp256k1_ge *local_1f0;
  secp256k1_ge *local_1e8;
  size_t local_1e0;
  secp256k1_scalar local_1d8;
  secp256k1_gej local_1b8;
  secp256k1_scalar *local_130;
  long local_128;
  ulong local_120;
  ulong local_118;
  size_t local_110;
  secp256k1_scalar *local_108;
  secp256k1_ecmult_context *local_100;
  secp256k1_sha256 local_f8;
  secp256k1_fe local_88;
  undefined1 local_58 [40];
  
  bVar33 = 0;
  lVar15 = 0x40;
  lVar12 = 0;
  sVar17 = nbits;
  do {
    lVar12 = lVar12 + (ulong)((uint)sVar17 & 1);
    sVar17 = sVar17 >> 1;
    lVar15 = lVar15 + -1;
  } while (lVar15 != 0);
  if (plen - 0x528 < 0xfffffffffffffbb9) {
    return 0;
  }
  if (0x40 < nbits) {
    return 0;
  }
  if (lVar12 != 1) {
    return 0;
  }
  local_318 = proof;
  local_300 = nbits;
  iVar10 = secp256k1_scratch_allocate_frame(scratch,n_proofs * 0x370,2);
  if (iVar10 == 0) {
    return 0;
  }
  sVar17 = scratch->frame;
  local_2e8 = (uchar **)plen;
  if (sVar17 == 0) {
LAB_0010fea6:
    local_320 = (void *)0x0;
  }
  else {
    sVar19 = n_proofs * 0x2f0;
    if ((void *)scratch->offset[sVar17 + 4] < (void *)((long)scratch->data[sVar17 + 4] + sVar19))
    goto LAB_0010fea6;
    local_320 = (void *)((long)scratch->data[sVar17 + 4] + (long)scratch->data[sVar17 - 1]);
    memset(local_320,0,sVar19);
    scratch->data[sVar17 + 4] = (void *)((long)scratch->data[sVar17 + 4] + sVar19);
  }
  sVar17 = scratch->frame;
  local_100 = ecmult_ctx;
  if (sVar17 == 0) {
LAB_0010fef3:
    local_328 = (void *)0x0;
  }
  else {
    sVar19 = n_proofs * 0x80;
    if ((void *)scratch->offset[sVar17 + 4] < (void *)((long)scratch->data[sVar17 + 4] + sVar19))
    goto LAB_0010fef3;
    local_328 = (void *)((long)scratch->data[sVar17 + 4] + (long)scratch->data[sVar17 - 1]);
    memset(local_328,0,sVar19);
    scratch->data[sVar17 + 4] = (void *)((long)scratch->data[sVar17 + 4] + sVar19);
  }
  local_2f8 = CONCAT44(local_2f8._4_4_,1);
  local_340 = n_proofs;
  if (1 < n_proofs) {
    lVar12 = n_proofs - 1;
    puVar13 = value_gen[1].y.n + 4;
    local_2f8 = CONCAT44(local_2f8._4_4_,1);
    do {
      local_1b8.x.n[0] = puVar13[-0x14] + (0x3ffffbfffff0bc - puVar13[-9]);
      local_1b8.x.n[1] = puVar13[-0x13] + (0x3ffffffffffffc - puVar13[-8]);
      local_1b8.x.n[2] = puVar13[-0x12] + (0x3ffffffffffffc - puVar13[-7]);
      local_1b8.x.n[3] = puVar13[-0x11] + (0x3ffffffffffffc - puVar13[-6]);
      local_1b8.x.n[4] = (0x3fffffffffffc - puVar13[-5]) + puVar13[-0x10];
      iVar10 = secp256k1_fe_normalizes_to_zero_var(&local_1b8.x);
      if (iVar10 == 0) {
LAB_0011007b:
        local_2f8 = local_2f8 & 0xffffffff00000000;
      }
      else {
        local_1b8.x.n[0] =
             puVar13[-0xf] + (0x3ffffbfffff0bc - ((secp256k1_fe *)(puVar13 + -4))->n[0]);
        local_1b8.x.n[1] = puVar13[-0xe] + (0x3ffffffffffffc - puVar13[-3]);
        local_1b8.x.n[2] = puVar13[-0xd] + (0x3ffffffffffffc - puVar13[-2]);
        local_1b8.x.n[3] = puVar13[-0xc] + (0x3ffffffffffffc - puVar13[-1]);
        local_1b8.x.n[4] = (0x3fffffffffffc - *puVar13) + puVar13[-0xb];
        iVar10 = secp256k1_fe_normalizes_to_zero_var(&local_1b8.x);
        if (iVar10 == 0) goto LAB_0011007b;
      }
      puVar13 = puVar13 + 0xb;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  sVar17 = local_340;
  local_338 = scratch;
  if (local_340 != 0) {
    local_2a0 = CONCAT44(local_2a0._4_4_,(int)(n_commits >> 8)) & 0xffffffff00ffffff;
    local_2a8 = CONCAT44(local_2a8._4_4_,(int)(n_commits >> 0x10)) & 0xffffffff0000ffff;
    local_2b0 = CONCAT44(local_2b0._4_4_,(int)(n_commits >> 0x18)) & 0xffffffff000000ff;
    local_2f0 = n_commits * local_300;
    local_310 = n_commits + 5;
    sVar29 = 0;
    do {
      local_268 = (undefined1  [16])0x0;
      local_278 = (undefined1  [16])0x0;
      local_58._16_16_ = (undefined1  [16])0x0;
      local_58._0_16_ = (undefined1  [16])0x0;
      if ((min_value != (uint64_t **)0x0) && (min_value[sVar29] != (uint64_t *)0x0)) {
        local_1b8.x.n[0] = 0xbb67ae856a09e667;
        local_1b8.x.n[1] = 0xa54ff53a3c6ef372;
        local_1b8.x.n[2] = 0x9b05688c510e527f;
        local_1b8.x.n[3] = 0x5be0cd191f83d9ab;
        local_1b8.z.n[2] = 0;
        secp256k1_sha256_write((secp256k1_sha256 *)&local_1b8,local_278,0x20);
        local_344 = CONCAT13((char)local_2b0,
                             CONCAT12((char)local_2a8,CONCAT11((char)local_2a0,(char)n_commits)));
        secp256k1_sha256_write((secp256k1_sha256 *)&local_1b8,(uchar *)&local_344,4);
        if (n_commits != 0) {
          sVar17 = 0;
          do {
            local_88.n[0] = min_value[sVar29][sVar17];
            secp256k1_sha256_write((secp256k1_sha256 *)&local_1b8,(uchar *)&local_88,8);
            sVar17 = sVar17 + 1;
          } while (n_commits != sVar17);
        }
        secp256k1_sha256_finalize((secp256k1_sha256 *)&local_1b8,local_278);
      }
      if (n_commits != 0) {
        lVar12 = 0;
        sVar17 = n_commits;
        do {
          secp256k1_bulletproof_update_commit
                    (local_278,(secp256k1_ge *)((long)(commitp[sVar29]->x).n + lVar12),
                     value_gen + sVar29);
          lVar12 = lVar12 + 0x58;
          sVar17 = sVar17 - 1;
        } while (sVar17 != 0);
      }
      if ((extra_commit != (uchar **)0x0) && (extra_commit[sVar29] != (uchar *)0x0)) {
        local_1b8.x.n[0] = 0xbb67ae856a09e667;
        local_1b8.x.n[1] = 0xa54ff53a3c6ef372;
        local_1b8.x.n[2] = 0x9b05688c510e527f;
        local_1b8.x.n[3] = 0x5be0cd191f83d9ab;
        local_1b8.z.n[2] = 0;
        secp256k1_sha256_write((secp256k1_sha256 *)&local_1b8,local_278,0x20);
        secp256k1_sha256_write
                  ((secp256k1_sha256 *)&local_1b8,extra_commit[sVar29],extra_commit_len[sVar29]);
        secp256k1_sha256_finalize((secp256k1_sha256 *)&local_1b8,local_278);
      }
      puVar31 = local_318[sVar29];
      secp256k1_fe_set_b32(&local_88,puVar31 + 0x41);
      iVar10 = secp256k1_ge_set_xquad((secp256k1_ge *)&local_f8,&local_88);
      if (iVar10 == 0) {
        return 0;
      }
      if ((puVar31[0x40] & 1) != 0) {
        secp256k1_ge_neg((secp256k1_ge *)&local_f8,(secp256k1_ge *)&local_f8);
      }
      if (iVar10 == 0) {
        return 0;
      }
      secp256k1_fe_set_b32(&local_88,puVar31 + 0x61);
      iVar10 = secp256k1_ge_set_xquad((secp256k1_ge *)local_220,&local_88);
      if (iVar10 == 0) {
        return 0;
      }
      if ((puVar31[0x40] & 2) != 0) {
        secp256k1_ge_neg((secp256k1_ge *)local_220,(secp256k1_ge *)local_220);
      }
      if (iVar10 == 0) {
        return 0;
      }
      secp256k1_bulletproof_update_commit
                (local_278,(secp256k1_ge *)&local_f8,(secp256k1_ge *)local_220);
      pvVar27 = local_320;
      lVar12 = sVar29 * 0x2f0;
      psVar20 = (secp256k1_scalar *)((long)local_320 + lVar12 + 0x1e0);
      secp256k1_scalar_set_b32(psVar20,local_278,(int *)&local_2d8);
      if (((int)local_2d8.d[0] != 0) ||
         (auVar36._0_4_ =
               -(uint)(*(int *)((long)pvVar27 + lVar12 + 0x1f0) == 0 && (int)psVar20->d[0] == 0),
         auVar36._4_4_ =
              -(uint)(*(int *)((long)pvVar27 + lVar12 + 500) == 0 &&
                     *(int *)((long)pvVar27 + lVar12 + 0x1e4) == 0),
         auVar36._8_4_ =
              -(uint)(*(int *)((long)pvVar27 + lVar12 + 0x1f8) == 0 &&
                     *(int *)((long)pvVar27 + lVar12 + 0x1e8) == 0),
         auVar36._12_4_ =
              -(uint)(*(int *)((long)pvVar27 + lVar12 + 0x1fc) == 0 &&
                     *(int *)((long)pvVar27 + lVar12 + 0x1ec) == 0),
         iVar10 = movmskps(extraout_EAX,auVar36), iVar10 == 0xf)) {
LAB_00110a16:
        sVar17 = local_338->frame;
        local_338->frame = sVar17 - 1;
        pvVar27 = local_338->data[sVar17 - 1];
LAB_00110a3f:
        free(pvVar27);
        return 0;
      }
      r_02 = (secp256k1_scalar *)(lVar12 + (long)pvVar27);
      secp256k1_bulletproof_update_commit
                (local_278,(secp256k1_ge *)&local_f8,(secp256k1_ge *)local_220);
      psVar24 = r_02 + 2;
      secp256k1_scalar_set_b32(psVar24,local_278,(int *)&local_2d8);
      if (((int)local_2d8.d[0] != 0) ||
         (auVar37._0_4_ = -(uint)((int)r_02[2].d[2] == 0 && (int)psVar24->d[0] == 0),
         auVar37._4_4_ =
              -(uint)(*(int *)((long)r_02[2].d + 0x14) == 0 && *(int *)((long)r_02[2].d + 4) == 0),
         auVar37._8_4_ = -(uint)((int)r_02[2].d[3] == 0 && (int)r_02[2].d[1] == 0),
         auVar37._12_4_ =
              -(uint)(*(int *)((long)r_02[2].d + 0x1c) == 0 && *(int *)((long)r_02[2].d + 0xc) == 0)
         , iVar10 = movmskps(extraout_EAX_00,auVar37), iVar10 == 0xf)) goto LAB_00110a16;
      r_00 = (secp256k1_ge *)(r_02 + 0x12);
      puVar31 = local_318[sVar29];
      local_308 = psVar20;
      local_2e0 = psVar24;
      secp256k1_fe_set_b32(&local_88,puVar31 + 0x81);
      iVar10 = secp256k1_ge_set_xquad(r_00,&local_88);
      if (iVar10 == 0) {
        return 0;
      }
      if ((puVar31[0x40] & 4) != 0) {
        secp256k1_ge_neg(r_00,r_00);
      }
      if (iVar10 == 0) {
        return 0;
      }
      r_01 = (secp256k1_ge *)(r_02[0x14].d + 3);
      puVar31 = local_318[sVar29];
      secp256k1_fe_set_b32(&local_88,puVar31 + 0xa1);
      iVar10 = secp256k1_ge_set_xquad(r_01,&local_88);
      if (iVar10 == 0) {
        return 0;
      }
      if ((puVar31[0x40] & 8) != 0) {
        secp256k1_ge_neg(r_01,r_01);
      }
      if (iVar10 == 0) {
        return 0;
      }
      secp256k1_bulletproof_update_commit(local_278,r_00,r_01);
      secp256k1_scalar_set_b32(r_02 + 7,local_278,(int *)&local_2d8);
      if (((int)local_2d8.d[0] != 0) ||
         (auVar38._0_4_ = -(uint)((int)r_02[7].d[2] == 0 && (int)r_02[7].d[0] == 0),
         auVar38._4_4_ =
              -(uint)(*(int *)((long)r_02[7].d + 0x14) == 0 && *(int *)((long)r_02[7].d + 4) == 0),
         auVar38._8_4_ = -(uint)((int)r_02[7].d[3] == 0 && (int)r_02[7].d[1] == 0),
         auVar38._12_4_ =
              -(uint)(*(int *)((long)r_02[7].d + 0x1c) == 0 && *(int *)((long)r_02[7].d + 0xc) == 0)
         , iVar10 = movmskps(extraout_EAX_01,auVar38), iVar10 == 0xf)) goto LAB_00110a16;
      secp256k1_scalar_inverse(r_02,local_308);
      sVar17 = local_300;
      psVar9 = local_338;
      uVar6 = r_02->d[0];
      uVar7 = r_02->d[1];
      uVar8 = r_02->d[3];
      r_02[1].d[2] = r_02->d[2];
      r_02[1].d[3] = uVar8;
      r_02[1].d[0] = uVar6;
      r_02[1].d[1] = uVar7;
      uVar25 = 0;
      while( true ) {
        psVar20 = local_2e0;
        if (sVar17 < 9) {
          uVar22 = *(ulong *)(&DAT_00130420 + sVar17 * 8);
        }
        else {
          uVar22 = 0;
          sVar16 = sVar17;
          do {
            uVar22 = uVar22 + 1;
            bVar32 = 3 < sVar16;
            sVar16 = sVar16 >> 1;
          } while (bVar32);
        }
        if (uVar22 <= uVar25) break;
        secp256k1_scalar_sqr(r_02 + 1,r_02 + 1);
        uVar25 = uVar25 + 1;
      }
      secp256k1_scalar_sqr(r_02 + 4,local_2e0);
      secp256k1_scalar_negate(r_02 + 6,psVar20);
      local_1b8.x.n[0] = 0xbb67ae856a09e667;
      local_1b8.x.n[1] = 0xa54ff53a3c6ef372;
      local_1b8.x.n[2] = 0x9b05688c510e527f;
      local_1b8.x.n[3] = 0x5be0cd191f83d9ab;
      local_1b8.z.n[2] = 0;
      secp256k1_sha256_write((secp256k1_sha256 *)&local_1b8,local_278,0x20);
      secp256k1_sha256_write((secp256k1_sha256 *)&local_1b8,local_318[sVar29],0x40);
      secp256k1_sha256_finalize((secp256k1_sha256 *)&local_1b8,local_278);
      local_1b8.x.n[0] = 0xbb67ae856a09e667;
      local_1b8.x.n[1] = 0xa54ff53a3c6ef372;
      local_1b8.x.n[2] = 0x9b05688c510e527f;
      local_1b8.x.n[3] = 0x5be0cd191f83d9ab;
      local_1b8.z.n[2] = 0;
      secp256k1_sha256_write((secp256k1_sha256 *)&local_1b8,local_278,0x20);
      secp256k1_sha256_finalize((secp256k1_sha256 *)&local_1b8,local_58);
      psVar20 = r_02 + 0xe;
      secp256k1_scalar_set_b32(psVar20,local_58,(int *)&local_2d8);
      if (((int)local_2d8.d[0] != 0) ||
         (auVar39._0_4_ = -(uint)((int)r_02[0xe].d[2] == 0 && (int)psVar20->d[0] == 0),
         auVar39._4_4_ =
              -(uint)(*(int *)((long)r_02[0xe].d + 0x14) == 0 &&
                     *(int *)((long)r_02[0xe].d + 4) == 0),
         auVar39._8_4_ = -(uint)((int)r_02[0xe].d[3] == 0 && (int)r_02[0xe].d[1] == 0),
         auVar39._12_4_ =
              -(uint)(*(int *)((long)r_02[0xe].d + 0x1c) == 0 &&
                     *(int *)((long)r_02[0xe].d + 0xc) == 0),
         iVar10 = movmskps(extraout_EAX_02,auVar39), iVar10 == 0xf)) {
LAB_00110a2e:
        sVar17 = psVar9->frame;
        psVar9->frame = sVar17 - 1;
        pvVar27 = psVar9->data[sVar17 - 1];
        goto LAB_00110a3f;
      }
      puVar31 = local_318[sVar29];
      secp256k1_scalar_set_b32(&local_298,puVar31,(int *)&local_2d8);
      if (((int)local_2d8.d[0] != 0) ||
         ((((local_298.d[3] == 0 && local_298.d[1] == 0) &&
            (local_298.d[2] == 0 && local_298.d[0] == 0) ||
           (secp256k1_scalar_set_b32(&local_240,puVar31 + 0x20,(int *)&local_2d8),
           (int)local_2d8.d[0] != 0)) ||
          ((local_240.d[3] == 0 && local_240.d[1] == 0) &&
           (local_240.d[2] == 0 && local_240.d[0] == 0))))) goto LAB_00110a2e;
      secp256k1_scalar_set_b32(r_02 + 0x10,puVar31 + 0xc1,(int *)&local_2d8);
      sVar17 = local_340;
      if (((int)local_2d8.d[0] != 0) ||
         (auVar40._0_4_ = -(uint)((int)r_02[0x10].d[2] == 0 && (int)r_02[0x10].d[0] == 0),
         auVar40._4_4_ =
              -(uint)(*(int *)((long)r_02[0x10].d + 0x14) == 0 &&
                     *(int *)((long)r_02[0x10].d + 4) == 0),
         auVar40._8_4_ = -(uint)((int)r_02[0x10].d[3] == 0 && (int)r_02[0x10].d[1] == 0),
         auVar40._12_4_ =
              -(uint)(*(int *)((long)r_02[0x10].d + 0x1c) == 0 &&
                     *(int *)((long)r_02[0x10].d + 0xc) == 0),
         iVar10 = movmskps(extraout_EAX_03,auVar40), iVar10 == 0xf)) goto LAB_00110a2e;
      psVar21 = &local_f8;
      psVar24 = r_02 + 8;
      for (lVar12 = 0xb; lVar12 != 0; lVar12 = lVar12 + -1) {
        psVar24->d[0] = *(uint64_t *)psVar21->s;
        psVar21 = (secp256k1_sha256 *)((long)psVar21 + ((ulong)bVar33 * -2 + 1) * 8);
        psVar24 = (secp256k1_scalar *)((long)psVar24 + ((ulong)bVar33 * -2 + 1) * 8);
      }
      puVar13 = (uint64_t *)local_220;
      puVar23 = r_02[10].d + 3;
      for (lVar12 = 0xb; lVar12 != 0; lVar12 = lVar12 + -1) {
        *puVar23 = *puVar13;
        puVar13 = puVar13 + (ulong)bVar33 * -2 + 1;
        puVar23 = puVar23 + (ulong)bVar33 * -2 + 1;
      }
      r_02[0xd].d[2] = local_2f0;
      r_02[0xd].d[3] = 0;
      r_02[0x11].d[0] = (uint64_t)(value_gen + sVar29);
      if (min_value == (uint64_t **)0x0) {
        puVar13 = (uint64_t *)0x0;
      }
      else {
        puVar13 = min_value[sVar29];
      }
      r_02[0x11].d[2] = (uint64_t)puVar13;
      r_02[0x11].d[1] = (uint64_t)commitp[sVar29];
      r_02[0x11].d[3] = n_commits;
      secp256k1_scalar_mul(&local_298,&local_298,psVar20);
      secp256k1_scalar_add(&local_240,&local_240,&local_298);
      lVar12 = sVar29 * 0x80;
      *(uchar **)((long)local_328 + lVar12) = local_318[sVar29] + 0xc1;
      puVar13 = (uint64_t *)((long)local_328 + lVar12 + 0x18);
      *puVar13 = local_240.d[2];
      puVar13[1] = local_240.d[3];
      puVar13 = (uint64_t *)((long)local_328 + lVar12 + 8);
      *puVar13 = local_240.d[0];
      puVar13[1] = local_240.d[1];
      puVar3 = (undefined8 *)((long)local_328 + lVar12 + 0x48);
      *puVar3 = local_278._0_8_;
      puVar3[1] = local_278._8_8_;
      puVar3 = (undefined8 *)((long)local_328 + lVar12 + 0x58);
      *puVar3 = local_268._0_8_;
      puVar3[1] = local_268._8_8_;
      uVar6 = r_02->d[0];
      uVar7 = r_02->d[1];
      uVar8 = r_02->d[3];
      puVar13 = (uint64_t *)((long)local_328 + lVar12 + 0x38);
      *puVar13 = r_02->d[2];
      puVar13[1] = uVar8;
      puVar13 = (uint64_t *)((long)local_328 + lVar12 + 0x28);
      *puVar13 = uVar6;
      puVar13[1] = uVar7;
      *(code **)((long)local_328 + lVar12 + 0x68) = secp256k1_bulletproof_rangeproof_vfy_callback;
      *(secp256k1_scalar **)((long)local_328 + lVar12 + 0x70) = r_02;
      *(size_t *)((long)local_328 + lVar12 + 0x78) = local_310;
      sVar29 = sVar29 + 1;
    } while (sVar29 != sVar17);
  }
  local_310 = n_commits * local_300;
  ppuVar30 = (uchar **)((long)local_2e8 - 0xc1);
  local_320 = (void *)0x0;
  iVar10 = (int)local_2f8;
  bVar32 = (int)local_2f8 != 0;
  ppuVar14 = (uchar **)secp256k1_bulletproof_innerproduct_proof_length(local_310);
  iVar18 = 0;
  if (ppuVar14 != ppuVar30) goto LAB_00111427;
  if (sVar17 == 0) {
    iVar18 = 1;
    goto LAB_00111427;
  }
  iVar11 = secp256k1_scratch_allocate_frame(local_338,sVar17 * 0x10d0,2);
  sVar29 = local_310;
  psVar9 = local_338;
  if (iVar11 == 0) goto LAB_00111427;
  local_2f0 = local_310 * 2;
  local_1f8 = gens->blinding_gen;
  local_1f0 = gens->gens;
  local_1e8 = local_1f0 + (gens->n >> 1);
  local_1e0 = local_310;
  if (local_2f0 < 0x24) {
    local_1d8.d[0] = *(uint64_t *)(&DAT_00130420 + (local_2f0 >> 2) * 8);
  }
  else {
    local_1d8.d[0] = 0;
    uVar25 = local_2f0 >> 2;
    do {
      local_1d8.d[0] = local_1d8.d[0] + 1;
      bVar5 = 3 < uVar25;
      uVar25 = uVar25 >> 1;
    } while (bVar5);
  }
  local_320 = (void *)CONCAT71((int7)((ulong)local_320 >> 8),bVar32);
  local_1d8.d[1]._0_4_ = iVar10;
  sVar16 = local_338->frame;
  local_2e8 = ppuVar30;
  local_220._0_8_ = sVar17;
  if (sVar16 == 0) {
    pvVar27 = (void *)0x0;
  }
  else {
    sVar19 = local_340 * 0x20;
    if ((void *)local_338->offset[sVar16 + 4] < (void *)((long)local_338->data[sVar16 + 4] + sVar19)
       ) {
      pvVar27 = (void *)0x0;
    }
    else {
      pvVar27 = (void *)((long)local_338->data[sVar16 + 4] + (long)local_338->data[sVar16 - 1]);
      memset(pvVar27,0,sVar19);
      psVar9->data[sVar16 + 4] = (void *)((long)psVar9->data[sVar16 + 4] + sVar19);
    }
  }
  sVar17 = psVar9->frame;
  local_1d8.d[2] = (uint64_t)pvVar27;
  if (sVar17 == 0) {
LAB_00110b08:
    pvVar27 = (void *)0x0;
  }
  else {
    sVar19 = local_340 * 0x10b0;
    if ((void *)psVar9->offset[sVar17 + 4] < (void *)((long)psVar9->data[sVar17 + 4] + sVar19))
    goto LAB_00110b08;
    pvVar27 = (void *)((long)psVar9->data[sVar17 + 4] + (long)psVar9->data[sVar17 - 1]);
    memset(pvVar27,0,sVar19);
    psVar9->data[sVar17 + 4] = (void *)((long)psVar9->data[sVar17 + 4] + sVar19);
  }
  ppuVar14 = local_2e8;
  sVar17 = (long)local_320 + sVar29 * 2 + 1;
  local_320 = (void *)-(long)local_320;
  local_f8.s[0] = 0x6a09e667;
  local_f8.s[1] = 0xbb67ae85;
  local_f8.s[2] = 0x3c6ef372;
  local_f8.s[3] = 0xa54ff53a;
  local_f8.s[4] = 0x510e527f;
  local_f8.s[5] = 0x9b05688c;
  local_f8.s[6] = 0x1f83d9ab;
  local_f8.s[7] = 0x5be0cd19;
  sVar29 = local_340 + (local_340 == 0);
  local_f8.bytes = 0;
  puVar31 = (uchar *)((long)local_328 + 0x48);
  local_340 = sVar29;
  local_1d8.d[3] = (uint64_t)pvVar27;
  do {
    secp256k1_sha256_write(&local_f8,*(uchar **)(puVar31 + -0x48),(size_t)ppuVar14);
    secp256k1_sha256_write(&local_f8,puVar31,0x20);
    secp256k1_scalar_get_b32((uchar *)&local_88,(secp256k1_scalar *)(puVar31 + -0x40));
    secp256k1_sha256_write(&local_f8,(uchar *)&local_88,0x20);
    puVar31 = puVar31 + 0x80;
    sVar29 = sVar29 - 1;
  } while (sVar29 != 0);
  secp256k1_sha256_finalize(&local_f8,(uchar *)&local_88);
  local_208 = 0;
  uStack_200 = 0;
  local_220._8_8_ = 0;
  uStack_210 = 0;
  local_118 = 4;
  if (local_2f0 < 4) {
    local_118 = local_2f0;
  }
  local_248 = local_118 >> 1 & 0x7fffffff;
  local_108 = (secp256k1_scalar *)((long)local_1b8.x.n + (ulong)(uint)((int)local_248 << 5));
  local_120 = local_118 - 1;
  local_128 = local_118 * 0x20 + -0x20;
  local_2b8 = local_1b8.x.n + local_118 * 4 + -4;
  local_2b0 = local_118 + (local_118 == 0);
  uVar25 = (ulong)(uint)((int)local_118 << 5);
  local_130 = (secp256k1_scalar *)((long)local_1d8.d + uVar25);
  uVar25 = uVar25 - 0x38;
  ppuVar14 = (uchar **)0x88;
  sVar29 = 0;
  pvVar27 = local_328;
  sVar16 = local_340;
  do {
    lVar15 = sVar17 + (long)local_320;
    lVar26 = sVar29 * 0x80;
    puVar31 = *(uchar **)((long)pvVar27 + lVar26);
    local_300 = local_1d8.d[0];
    lVar12 = *(long *)((long)pvVar27 + lVar26 + 0x78);
    local_318 = ppuVar14;
    local_2f8 = uVar25;
    secp256k1_scalar_set_b32((secp256k1_scalar *)local_58,puVar31,&local_344);
    if (local_344 == 0) {
      pvVar27 = (void *)(lVar26 + (long)pvVar27);
      local_f8.s[0] = 0x6a09e667;
      local_f8.s[1] = 0xbb67ae85;
      local_f8.s[2] = 0x3c6ef372;
      local_f8.s[3] = 0xa54ff53a;
      local_f8.s[4] = 0x510e527f;
      local_f8.s[5] = 0x9b05688c;
      local_f8.s[6] = 0x1f83d9ab;
      local_f8.s[7] = 0x5be0cd19;
      local_f8.bytes = 0;
      secp256k1_sha256_write(&local_f8,(uchar *)((long)pvVar27 + 0x48),0x20);
      secp256k1_sha256_write(&local_f8,puVar31,0x20);
      secp256k1_sha256_finalize(&local_f8,local_278);
      psVar20 = (secp256k1_scalar *)(puVar31 + 0x20);
      if (local_2f0 != 0) {
        r_03 = &local_1b8;
        uVar25 = local_2b0;
        do {
          secp256k1_scalar_set_b32((secp256k1_scalar *)r_03,(uchar *)psVar20,&local_344);
          if ((local_344 != 0) ||
             (auVar34._0_4_ = -(uint)((int)(r_03->x).n[0] == 0 && (int)(r_03->x).n[2] == 0),
             auVar34._4_4_ =
                  -(uint)(*(int *)((long)(r_03->x).n + 4) == 0 &&
                         *(int *)((long)(r_03->x).n + 0x14) == 0),
             auVar34._8_4_ = -(uint)((int)(r_03->x).n[1] == 0 && (int)(r_03->x).n[3] == 0),
             auVar34._12_4_ =
                  -(uint)(*(int *)((long)(r_03->x).n + 0xc) == 0 &&
                         *(int *)((long)(r_03->x).n + 0x1c) == 0),
             iVar10 = movmskps(extraout_EAX_04,auVar34), iVar10 == 0xf)) goto LAB_00110e91;
          psVar20 = psVar20 + 1;
          r_03 = (secp256k1_gej *)((r_03->x).n + 4);
          uVar25 = uVar25 - 1;
        } while (uVar25 != 0);
      }
      secp256k1_scalar_dot_product(&local_298,(secp256k1_scalar *)&local_1b8,local_108,local_248);
      local_308 = (secp256k1_scalar *)(sVar29 * 0x10b0);
      *(void **)(local_1d8.d[3] + (long)local_308) = pvVar27;
      local_f8.s[0] = 0x6a09e667;
      local_f8.s[1] = 0xbb67ae85;
      local_f8.s[2] = 0x3c6ef372;
      local_f8.s[3] = 0xa54ff53a;
      local_f8.s[4] = 0x510e527f;
      local_f8.s[5] = 0x9b05688c;
      local_f8.s[6] = 0x1f83d9ab;
      local_f8.s[7] = 0x5be0cd19;
      local_f8.bytes = 0;
      secp256k1_sha256_write(&local_f8,(uchar *)&local_88,0x20);
      secp256k1_sha256_finalize(&local_f8,(uchar *)&local_88);
      lVar26 = sVar29 * 0x20;
      secp256k1_scalar_set_b32
                ((secp256k1_scalar *)(local_1d8.d[2] + lVar26),(uchar *)&local_88,&local_344);
      uVar6 = local_1d8.d[2];
      if (local_344 == 0) {
        piVar2 = (int *)(local_1d8.d[2] + lVar26);
        piVar4 = (int *)(local_1d8.d[2] + lVar26 + 0x10);
        auVar41._0_4_ = -(uint)(*piVar4 == 0 && *piVar2 == 0);
        auVar41._4_4_ = -(uint)(piVar4[1] == 0 && piVar2[1] == 0);
        auVar41._8_4_ = -(uint)(piVar4[2] == 0 && piVar2[2] == 0);
        auVar41._12_4_ = -(uint)(piVar4[3] == 0 && piVar2[3] == 0);
        iVar10 = movmskps(extraout_EAX_05,auVar41);
        if (((iVar10 != 0xf) &&
            (secp256k1_scalar_set_b32(&local_240,local_278,&local_344), local_344 == 0)) &&
           ((local_240.d[3] != 0 || local_240.d[1] != 0) ||
            (local_240.d[2] != 0 || local_240.d[0] != 0))) {
          local_250 = lVar26;
          secp256k1_scalar_negate(&local_298,&local_298);
          secp256k1_scalar_add(&local_298,&local_298,(secp256k1_scalar *)local_58);
          secp256k1_scalar_mul(&local_240,&local_240,&local_298);
          secp256k1_scalar_add(&local_240,&local_240,(secp256k1_scalar *)((long)pvVar27 + 8));
          secp256k1_scalar_mul(&local_240,&local_240,(secp256k1_scalar *)(uVar6 + lVar26));
          lVar26 = local_250;
          iVar10 = secp256k1_scalar_add
                             ((secp256k1_scalar *)(local_220 + 8),
                              (secp256k1_scalar *)(local_220 + 8),&local_240);
          if (local_2f0 < 5) {
            auVar35._0_4_ = -(uint)((int)local_298.d[2] == 0 && (int)local_298.d[0] == 0);
            auVar35._4_4_ = -(uint)(local_298.d[2]._4_4_ == 0 && local_298.d[0]._4_4_ == 0);
            auVar35._8_4_ = -(uint)((int)local_298.d[3] == 0 && (int)local_298.d[1] == 0);
            auVar35._12_4_ = -(uint)(local_298.d[3]._4_4_ == 0 && local_298.d[1]._4_4_ == 0);
            iVar10 = movmskps(iVar10,auVar35);
            if (iVar10 != 0xf) goto LAB_00110e91;
            if (local_310 == 0) {
              iVar10 = 7;
              pvVar27 = local_328;
              sVar16 = local_340;
              goto LAB_00110ebb;
            }
          }
          *(secp256k1_scalar **)(local_1d8.d[3] + (long)(local_308[0x85].d + 1)) = psVar20;
          local_298.d[0] = *local_2b8;
          local_298.d[1] = local_2b8[1];
          local_298.d[2] = local_2b8[2];
          local_298.d[3] = local_2b8[3];
          puVar13 = (uint64_t *)(local_1d8.d[2] + lVar26);
          uVar6 = *puVar13;
          uVar7 = puVar13[1];
          puVar13 = (uint64_t *)(local_1d8.d[2] + lVar26 + 0x10);
          uVar8 = puVar13[1];
          local_2b8[2] = *puVar13;
          local_2b8[3] = uVar8;
          *local_2b8 = uVar6;
          local_2b8[1] = uVar7;
          if (local_1d8.d[0] != 0) {
            uVar22 = 0;
            uVar25 = 0;
            ppuVar14 = local_318;
            psVar24 = psVar20;
            local_110 = sVar29;
            do {
              sVar29 = local_110;
              uVar28 = local_1d8.d[0] * 2 + 7 >> 3;
              bVar33 = *(byte *)((long)psVar20->d + (uVar22 >> 3));
              local_329 = (bVar33 >> ((int)uVar22 + 1U & 7) & 1) != 0 |
                          (bVar33 >> ((byte)uVar22 & 6)) * '\x02' & 2;
              local_f8.s[0] = 0x6a09e667;
              local_f8.s[1] = 0xbb67ae85;
              local_f8.s[2] = 0x3c6ef372;
              local_f8.s[3] = 0xa54ff53a;
              local_f8.s[4] = 0x510e527f;
              local_f8.s[5] = 0x9b05688c;
              local_f8.s[6] = 0x1f83d9ab;
              local_f8.s[7] = 0x5be0cd19;
              local_f8.bytes = 0;
              local_2e8 = ppuVar14;
              local_2e0 = psVar24;
              local_2a8 = uVar25;
              local_2a0 = uVar22;
              secp256k1_sha256_write(&local_f8,local_278,0x20);
              secp256k1_sha256_write(&local_f8,&local_329,1);
              secp256k1_sha256_write(&local_f8,(uchar *)((long)local_2e0->d + uVar28),0x20);
              psVar24 = local_2e0;
              secp256k1_sha256_write(&local_f8,(uchar *)((long)local_2e0[1].d + uVar28),0x20);
              secp256k1_sha256_finalize(&local_f8,local_278);
              secp256k1_scalar_set_b32(&local_2d8,local_278,&local_344);
              if ((local_344 != 0) ||
                 ((local_2d8.d[3] == 0 && local_2d8.d[1] == 0) &&
                  (local_2d8.d[2] == 0 && CONCAT44(local_2d8.d[0]._4_4_,(int)local_2d8.d[0]) == 0)))
              goto LAB_00110e91;
              secp256k1_scalar_mul
                        ((secp256k1_scalar *)local_2b8,(secp256k1_scalar *)local_2b8,&local_2d8);
              uVar25 = local_2a8;
              ppuVar14 = local_2e8;
              secp256k1_scalar_sqr
                        ((secp256k1_scalar *)(local_1d8.d[3] + (long)local_2e8),&local_2d8);
              uVar25 = uVar25 + 1;
              ppuVar14 = ppuVar14 + 4;
              psVar24 = psVar24 + 2;
              uVar22 = local_2a0 + 2;
              sVar29 = local_110;
            } while (uVar25 < local_1d8.d[0]);
          }
          psVar20 = local_308;
          secp256k1_scalar_inverse_all_var
                    ((secp256k1_scalar *)(local_1d8.d[3] + (long)local_308 + 8),
                     (secp256k1_scalar *)&local_1b8,local_118);
          local_2b8[2] = local_298.d[2];
          local_2b8[3] = local_298.d[3];
          *local_2b8 = local_298.d[0];
          local_2b8[1] = local_298.d[1];
          secp256k1_scalar_negate
                    ((secp256k1_scalar *)((long)(psVar20[0x84].d + 1) + local_1d8.d[3]),
                     (secp256k1_scalar *)(local_1d8.d[3] + (long)psVar20 + 8));
          psVar24 = (secp256k1_scalar *)(local_1d8.d[3] + (long)psVar20 + 0x1088);
          secp256k1_scalar_mul
                    (psVar24,psVar24,
                     (secp256k1_scalar *)(local_128 + local_1d8.d[3] + (long)psVar20 + 8));
          uVar25 = local_248;
          uVar22 = local_120;
          psVar20 = local_130;
          uVar28 = local_2f8;
          do {
            uVar1 = uVar22 - 1;
            if (uVar25 == uVar22) {
              uVar22 = 0xffffffffffffffff;
            }
            secp256k1_scalar_mul
                      ((secp256k1_scalar *)(local_1d8.d[3] + uVar28),
                       (secp256k1_scalar *)
                       ((uVar22 & uVar1) * 0x20 + local_1d8.d[3] + (long)local_308 + 8),psVar20);
            psVar20 = psVar20 + -1;
            uVar28 = uVar28 - 0x20;
            uVar22 = uVar1;
          } while (uVar1 != 0);
          secp256k1_scalar_mul
                    (&local_298,(secp256k1_scalar *)(local_250 + local_1d8.d[2]),
                     (secp256k1_scalar *)&local_1b8);
          secp256k1_scalar_sqr(&local_298,&local_298);
          secp256k1_scalar_mul
                    ((secp256k1_scalar *)(local_1d8.d[3] + (long)local_308 + 0xc88),
                     (secp256k1_scalar *)(local_1d8.d[3] + (long)local_308 + 0x1088),&local_298);
          iVar10 = 0;
          pvVar27 = local_328;
          sVar16 = local_340;
          goto LAB_00110ebb;
        }
      }
LAB_00110e91:
      sVar17 = local_338->frame;
      local_338->frame = sVar17 - 1;
      free(local_338->data[sVar17 - 1]);
      iVar10 = 1;
      pvVar27 = local_328;
      sVar16 = local_340;
    }
    else {
      sVar17 = local_338->frame;
      local_338->frame = sVar17 - 1;
      free(local_338->data[sVar17 - 1]);
      iVar10 = 1;
    }
LAB_00110ebb:
    psVar9 = local_338;
    if ((iVar10 != 7) && (iVar10 != 0)) {
      iVar18 = 0;
      goto LAB_00111427;
    }
    sVar17 = lVar15 + lVar12 + local_300 * 2;
    sVar29 = sVar29 + 1;
    ppuVar14 = local_318 + 0x216;
    uVar25 = local_2f8 + 0x10b0;
  } while (sVar29 != sVar16);
  iVar10 = secp256k1_ecmult_multi_var
                     (local_100,local_338,&local_1b8,(secp256k1_scalar *)0x0,
                      secp256k1_bulletproof_innerproduct_vfy_ecmult_callback,local_220,sVar17);
  sVar17 = psVar9->frame;
  psVar9->frame = sVar17 - 1;
  free(psVar9->data[sVar17 - 1]);
  iVar18 = 0;
  if (iVar10 == 1) {
    iVar18 = local_1b8.infinity;
  }
LAB_00111427:
  sVar17 = local_338->frame;
  local_338->frame = sVar17 - 1;
  free(local_338->data[sVar17 - 1]);
  return iVar18;
}

Assistant:

static int secp256k1_bulletproof_rangeproof_verify_impl(const secp256k1_ecmult_context *ecmult_ctx, secp256k1_scratch *scratch, const unsigned char* const* proof, const size_t n_proofs, const size_t plen, size_t nbits, const uint64_t* const* min_value, const secp256k1_ge* const* commitp, size_t n_commits, const secp256k1_ge *value_gen, const secp256k1_bulletproof_generators *gens, const unsigned char* const* extra_commit, size_t *extra_commit_len) {
    secp256k1_bulletproof_vfy_ecmult_context *ecmult_data;
    secp256k1_bulletproof_innerproduct_context *innp_ctx;
    int ret;
    size_t i;
    int same_generators = 1;

    /* sanity-check input */
    if (secp256k1_popcountl(nbits) != 1 || nbits > MAX_NBITS) {
        return 0;
    }
    if (plen < 64 + 128 + 1 + 32) {  /* inner product argument will do a more precise check */
        return 0;
    }
    if (plen > SECP256K1_BULLETPROOF_MAX_PROOF) {
        return 0;
    }

    if (!secp256k1_scratch_allocate_frame(scratch, n_proofs * (sizeof(*ecmult_data) + sizeof(*innp_ctx)), 2)) {
        return 0;
    }
    ecmult_data = (secp256k1_bulletproof_vfy_ecmult_context *)secp256k1_scratch_alloc(scratch, n_proofs * sizeof(*ecmult_data));
    innp_ctx = (secp256k1_bulletproof_innerproduct_context *)secp256k1_scratch_alloc(scratch, n_proofs * sizeof(*innp_ctx));

    /* Check if all generators are equal. If so, we can amortize all their scalar multiplications
     * by them and save one scalar-ge multiplication per proof. */
    VERIFY_CHECK(!secp256k1_ge_is_infinity(&value_gen[0]));
    for (i = 1; i < n_proofs; i++) {
        VERIFY_CHECK(!secp256k1_ge_is_infinity(&value_gen[i]));
        if (!secp256k1_fe_equal_var(&value_gen[i].x, &value_gen[i - 1].x) ||
            !secp256k1_fe_equal_var(&value_gen[i].y, &value_gen[i - 1].y)) {
            same_generators = 0;
        }
    }

    for (i = 0; i < n_proofs; i++) {
        secp256k1_sha256 sha256;
        unsigned char commit[32] = {0};
        unsigned char randomizer61[32] = {0};  /* randomizer for eq (61) so we can add it to eq (62) to save a separate multiexp */
        secp256k1_scalar taux, mu;
        secp256k1_ge age, sge;
        int overflow;
        size_t j;

        /* Commit to all input data: min value, pedersen commit, asset generator, extra_commit */
        if (min_value != NULL && min_value[i] != NULL) {
            unsigned char len[4];
            secp256k1_sha256_initialize(&sha256);
            secp256k1_sha256_write(&sha256, commit, 32);
            len[0] = n_commits;
            len[1] = n_commits >> 8;
            len[2] = n_commits >> 16;
            len[3] = n_commits >> 24;
            secp256k1_sha256_write(&sha256, len, 4);
            for (j = 0; j < n_commits; j++) {
                unsigned char vbuf[8];
                vbuf[0] = min_value[i][j];
                vbuf[1] = min_value[i][j] >> 8;
                vbuf[2] = min_value[i][j] >> 16;
                vbuf[3] = min_value[i][j] >> 24;
                vbuf[4] = min_value[i][j] >> 32;
                vbuf[5] = min_value[i][j] >> 40;
                vbuf[6] = min_value[i][j] >> 48;
                vbuf[7] = min_value[i][j] >> 56;
                secp256k1_sha256_write(&sha256, vbuf, 8);
            }
            secp256k1_sha256_finalize(&sha256, commit);
        }
        for (j = 0; j < n_commits; j++) {
            secp256k1_bulletproof_update_commit(commit, &commitp[i][j], &value_gen[i]);
        }
        if (extra_commit != NULL && extra_commit[i] != NULL) {
            secp256k1_sha256_initialize(&sha256);
            secp256k1_sha256_write(&sha256, commit, 32);
            secp256k1_sha256_write(&sha256, extra_commit[i], extra_commit_len[i]);
            secp256k1_sha256_finalize(&sha256, commit);
        }

        /* Compute y, z, x */
        if (!secp256k1_bulletproof_deserialize_point(&age, &proof[i][64], 0, 4) ||
            !secp256k1_bulletproof_deserialize_point(&sge, &proof[i][64], 1, 4)) {
            return 0;
        }

        secp256k1_bulletproof_update_commit(commit, &age, &sge);
        secp256k1_scalar_set_b32(&ecmult_data[i].y, commit, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ecmult_data[i].y)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }
        secp256k1_bulletproof_update_commit(commit, &age, &sge);
        secp256k1_scalar_set_b32(&ecmult_data[i].z, commit, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ecmult_data[i].z)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }

        if (!secp256k1_bulletproof_deserialize_point(&ecmult_data[i].t1, &proof[i][64], 2, 4) ||
            !secp256k1_bulletproof_deserialize_point(&ecmult_data[i].t2, &proof[i][64], 3, 4)) {
            return 0;
        }

        secp256k1_bulletproof_update_commit(commit, &ecmult_data[i].t1, &ecmult_data[i].t2);
        secp256k1_scalar_set_b32(&ecmult_data[i].x, commit, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ecmult_data[i].x)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }

        /* compute exponent offsets */
        secp256k1_scalar_inverse_var(&ecmult_data[i].yinv, &ecmult_data[i].y);  /* TODO somehow batch this w the inner-product argument inverse */
        ecmult_data[i].yinvn = ecmult_data[i].yinv;
        for (j = 0; j < secp256k1_floor_lg(nbits); j++) {
            secp256k1_scalar_sqr(&ecmult_data[i].yinvn, &ecmult_data[i].yinvn);
        }
        secp256k1_scalar_sqr(&ecmult_data[i].zsq, &ecmult_data[i].z);
        secp256k1_scalar_negate(&ecmult_data[i].negz, &ecmult_data[i].z);

        /* Update commit with remaining data for the inner product proof */
        secp256k1_sha256_initialize(&sha256);
        secp256k1_sha256_write(&sha256, commit, 32);
        secp256k1_sha256_write(&sha256, &proof[i][0], 64);
        secp256k1_sha256_finalize(&sha256, commit);

        secp256k1_sha256_initialize(&sha256);
        secp256k1_sha256_write(&sha256, commit, 32);
        secp256k1_sha256_finalize(&sha256, randomizer61);
        secp256k1_scalar_set_b32(&ecmult_data[i].randomizer61, randomizer61, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ecmult_data[i].randomizer61)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }

        /* Deserialize everything else */
        secp256k1_scalar_set_b32(&taux, &proof[i][0], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&taux)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }
        secp256k1_scalar_set_b32(&mu, &proof[i][32], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&mu)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }
        /* A little sketchy, we read t (l(x) . r(x)) off the front of the inner product proof,
         * which we otherwise treat as a black box */
        secp256k1_scalar_set_b32(&ecmult_data[i].t, &proof[i][64 + 128 + 1], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ecmult_data[i].t)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }

        /* Verify inner product proof */
        ecmult_data[i].a = age;
        ecmult_data[i].s = sge;
        ecmult_data[i].n = nbits * n_commits;
        ecmult_data[i].count = 0;
        ecmult_data[i].asset = &value_gen[i];
        ecmult_data[i].min_value = min_value == NULL ? NULL : min_value[i];
        ecmult_data[i].commit = commitp[i];
        ecmult_data[i].n_commits = n_commits;
        secp256k1_scalar_mul(&taux, &taux, &ecmult_data[i].randomizer61);
        secp256k1_scalar_add(&mu, &mu, &taux);

        innp_ctx[i].proof = &proof[i][64 + 128 + 1];
        innp_ctx[i].p_offs = mu;
        memcpy(innp_ctx[i].commit, commit, 32);
        innp_ctx[i].yinv = ecmult_data[i].yinv;
        innp_ctx[i].rangeproof_cb = secp256k1_bulletproof_rangeproof_vfy_callback;
        innp_ctx[i].rangeproof_cb_data = (void *) &ecmult_data[i];
        innp_ctx[i].n_extra_rangeproof_points = 5 + n_commits;
    }

    ret = secp256k1_bulletproof_inner_product_verify_impl(ecmult_ctx, scratch, gens, nbits * n_commits, innp_ctx, n_proofs, plen - (64 + 128 + 1), same_generators);
    secp256k1_scratch_deallocate_frame(scratch);
    return ret;
}